

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_SetStreamFinishedCallback
                  (PaStream *stream,PaStreamFinishedCallback *streamFinishedCallback)

{
  undefined8 in_RSI;
  PaStream *in_RDI;
  PaError result;
  undefined4 local_14;
  
  local_14 = PaUtil_ValidateStreamPointer(in_RDI);
  if (local_14 == 0) {
    local_14 = (**(code **)(*(long *)((long)in_RDI + 0x10) + 0x20))(in_RDI);
    if (local_14 == 0) {
      local_14 = -0x26fe;
    }
    if (local_14 == 1) {
      *(undefined8 *)((long)in_RDI + 0x20) = in_RSI;
      local_14 = 0;
    }
  }
  return local_14;
}

Assistant:

PaError Pa_SetStreamFinishedCallback( PaStream *stream, PaStreamFinishedCallback* streamFinishedCallback )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_SetStreamFinishedCallback" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));
    PA_LOGAPI(("\tPaStreamFinishedCallback* streamFinishedCallback: 0x%p\n", streamFinishedCallback ));

    if( result == paNoError )
    {
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
        if( result == 0 )
        {
            result = paStreamIsNotStopped ;
        }
        if( result == 1 )
        {
            PA_STREAM_REP( stream )->streamFinishedCallback = streamFinishedCallback;
            result = paNoError;
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_SetStreamFinishedCallback", result );

    return result;

}